

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

uint8 * __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::_InternalSerialize
          (MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
           *this,uint8 *ptr,EpsCopyOutputStream *stream)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint8 *puVar5;
  uint8 *puVar6;
  string *s;
  
  iVar2 = (*(this->super_Message).super_MessageLite._vptr_MessageLite[0x14])();
  s = (string *)CONCAT44(extraout_var,iVar2);
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  __n = s->_M_string_length;
  if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)ptr)))) {
    *ptr = '\n';
    ptr[1] = (uint8)__n;
    memcpy(ptr + 2,(s->_M_dataplus)._M_p,__n);
    puVar5 = ptr + __n + 2;
  }
  else {
    puVar5 = io::EpsCopyOutputStream::WriteStringOutline(stream,1,s,ptr);
  }
  iVar2 = (*(this->super_Message).super_MessageLite._vptr_MessageLite[0x15])(this);
  if (stream->end_ <= puVar5) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar5);
  }
  *puVar5 = '\x12';
  uVar3 = (((Value *)CONCAT44(extraout_var_00,iVar2))->_cached_size_).size_.super___atomic_base<int>
          ._M_i;
  if (uVar3 < 0x80) {
    puVar5[1] = (byte)uVar3;
    puVar5 = puVar5 + 2;
  }
  else {
    puVar5[1] = (byte)uVar3 | 0x80;
    if (uVar3 < 0x4000) {
      puVar5[2] = (uint8)(uVar3 >> 7);
      puVar5 = puVar5 + 3;
    }
    else {
      puVar5 = puVar5 + 3;
      uVar3 = uVar3 >> 7;
      do {
        puVar6 = puVar5;
        puVar6[-1] = (byte)uVar3 | 0x80;
        uVar4 = uVar3 >> 7;
        puVar5 = puVar6 + 1;
        bVar1 = 0x3fff < uVar3;
        uVar3 = uVar4;
      } while (bVar1);
      *puVar6 = (uint8)uVar4;
    }
  }
  puVar5 = Value::_InternalSerialize((Value *)CONCAT44(extraout_var_00,iVar2),puVar5,stream);
  return puVar5;
}

Assistant:

::google::protobuf::uint8* _InternalSerialize(::google::protobuf::uint8* ptr,
                              io::EpsCopyOutputStream* stream) const override {
    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key(), ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value(), ptr, stream);
  }